

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_connect(connectdata *conn,_Bool *done)

{
  int iVar1;
  uint uVar2;
  CURLcode CVar3;
  size_t max;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  CVar3 = CURLE_OK;
  *done = false;
  (conn->bits).close = false;
  (conn->proto).ftpc.pp.response_time = (long)"rchive_entry_unset_birthtime";
  (conn->proto).ftpc.pp.statemach_act = pop3_statemach_act;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  *(undefined8 *)((long)&conn->proto + 0x90) = 0xffffffffffffffff;
  Curl_pp_init(&(conn->proto).ftpc.pp);
  pcVar4 = conn->options;
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    CVar3 = CURLE_OK;
    bVar6 = true;
    pcVar5 = pcVar4;
    do {
      for (; (*pcVar4 != '\0' && (*pcVar4 != '=')); pcVar4 = pcVar4 + 1) {
      }
      iVar1 = curl_strnequal(pcVar5,"AUTH",4);
      if (iVar1 == 0) {
        CVar3 = CURLE_URL_MALFORMAT;
      }
      else {
        if (bVar6) {
          *(undefined8 *)((long)&conn->proto + 0x90) = 0;
          bVar6 = false;
        }
        max = 0;
        pcVar5 = pcVar4 + 1;
        for (pcVar4 = pcVar5; (*pcVar4 != '\0' && (*pcVar4 != ';')); pcVar4 = pcVar4 + 1) {
          max = max + 1;
        }
        iVar1 = curl_strnequal(pcVar5,"*",max);
        if (iVar1 == 0) {
          iVar1 = curl_strnequal(pcVar5,"+APOP",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 2;
            uVar2 = 0;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"LOGIN",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 1;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"PLAIN",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 2;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"CRAM-MD5",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 4;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"DIGEST-MD5",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 8;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"GSSAPI",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 0x10;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"NTLM",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 0x40;
            goto LAB_0056f8bb;
          }
          iVar1 = curl_strnequal(pcVar5,"XOAUTH2",max);
          if (iVar1 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar2 = (conn->proto).pop3c.prefmech | 0x80;
            goto LAB_0056f8bb;
          }
        }
        else {
          (conn->proto).pop3c.preftype = 0xffffffff;
          uVar2 = 0xffffffff;
LAB_0056f8bb:
          (conn->proto).pop3c.prefmech = uVar2;
        }
        pcVar4 = pcVar4 + (*pcVar4 == ';');
      }
      pcVar5 = pcVar4;
    } while (*pcVar4 != '\0');
  }
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  (conn->proto).imapc.state = IMAP_SERVERGREET;
  CVar3 = pop3_multi_statemach(conn,done);
  return CVar3;
}

Assistant:

static CURLcode pop3_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = pop3_statemach_act;
  pp->endofresp = pop3_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  pop3c->prefmech = SASL_AUTH_ANY;

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, POP3_SERVERGREET);

  result = pop3_multi_statemach(conn, done);

  return result;
}